

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,string *param_2)

{
  cmExportSet *pcVar1;
  pointer puVar2;
  cmInstallTargetGenerator *pcVar3;
  cmTarget *this_00;
  TargetType TVar4;
  size_t sVar5;
  ostream *poVar6;
  cmTargetExport *pcVar7;
  pointer puVar8;
  long lVar9;
  bool bVar10;
  allocator<char> local_d1;
  string dest;
  string path;
  string installDir;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&installDir,
             (string *)
             &(((this->super_cmExportInstallFileGenerator).IEGen)->super_cmInstallGenerator).
              Destination);
  std::operator<<(os,"LOCAL_PATH := $(call my-dir)\n");
  sVar5 = cmsys::SystemTools::CountChar(installDir._M_dataplus._M_p,'/');
  lVar9 = (sVar5 + 1) - (ulong)(installDir._M_string_length == 0);
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
    std::__cxx11::string::append((char *)&path);
  }
  poVar6 = std::operator<<(os,"_IMPORT_PREFIX := $(LOCAL_PATH)");
  poVar6 = std::operator<<(poVar6,(string *)&path);
  std::operator<<(poVar6,"\n\n");
  pcVar1 = ((this->super_cmExportInstallFileGenerator).IEGen)->ExportSet;
  puVar2 = (pcVar1->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (pcVar1->TargetExports).
                super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    TVar4 = cmGeneratorTarget::GetType
                      (((puVar8->_M_t).
                        super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                        .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target);
    if (TVar4 != INTERFACE_LIBRARY) {
      dest._M_dataplus._M_p = (pointer)&dest.field_2;
      dest._M_string_length = 0;
      dest.field_2._M_local_buf[0] = '\0';
      pcVar7 = (puVar8->_M_t).
               super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
               super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
               super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
      pcVar3 = pcVar7->LibraryGenerator;
      if (pcVar3 != (cmInstallTargetGenerator *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_d1);
        cmInstallTargetGenerator::GetDestination(&local_50,pcVar3,&local_70);
        std::__cxx11::string::operator=((string *)&dest,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        pcVar7 = (puVar8->_M_t).
                 super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                 super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                 super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
      }
      pcVar3 = pcVar7->ArchiveGenerator;
      if (pcVar3 != (cmInstallTargetGenerator *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_d1);
        cmInstallTargetGenerator::GetDestination(&local_50,pcVar3,&local_70);
        std::__cxx11::string::operator=((string *)&dest,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        pcVar7 = (puVar8->_M_t).
                 super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                 super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                 super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
      }
      this_00 = pcVar7->Target->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"__dest",(allocator<char> *)&local_70);
      cmTarget::SetProperty(this_00,&local_50,&dest);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&dest);
    }
  }
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&installDir);
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode(
  std::ostream& os, const std::string&)
{
  std::string installDir = this->IEGen->GetDestination();
  os << "LOCAL_PATH := $(call my-dir)\n";
  size_t numDotDot = cmSystemTools::CountChar(installDir.c_str(), '/');
  numDotDot += installDir.empty() ? 0 : 1;
  std::string path;
  for (size_t n = 0; n < numDotDot; n++) {
    path += "/..";
  }
  os << "_IMPORT_PREFIX := $(LOCAL_PATH)" << path << "\n\n";
  for (std::unique_ptr<cmTargetExport> const& te :
       this->IEGen->GetExportSet()->GetTargetExports()) {
    // Collect import properties for this target.
    if (te->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::string dest;
    if (te->LibraryGenerator) {
      dest = te->LibraryGenerator->GetDestination("");
    }
    if (te->ArchiveGenerator) {
      dest = te->ArchiveGenerator->GetDestination("");
    }
    te->Target->Target->SetProperty("__dest", dest);
  }
}